

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O3

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  stbrp_context *psVar5;
  uint uVar6;
  stbrp_context *in_RAX;
  stbrp_context *extraout_RAX;
  stbrp_node **ppsVar7;
  stbrp_context *extraout_RAX_00;
  int iVar8;
  int *piVar9;
  stbrp_context *psVar10;
  stbrp_node *psVar11;
  uint uVar12;
  stbrp_context *psVar13;
  ulong uVar14;
  stbrp_node *in_R8;
  stbrp_node *psVar15;
  stbrp_rect *psVar16;
  int iVar17;
  int iVar18;
  int x0;
  size_t __nmemb;
  uint uVar19;
  ulong uVar20;
  stbrp_node *psVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  int waste;
  uint local_a0;
  int local_9c;
  stbrp_node *local_90;
  stbrp_context *local_80;
  uint local_78;
  int local_68;
  int local_64;
  size_t local_60;
  ulong local_58;
  ulong local_50;
  stbrp_rect *local_48;
  ulong local_40;
  stbrp_rect *local_38;
  long lVar24;
  
  auVar4 = _DAT_0015f440;
  uVar20 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    in_RAX = (stbrp_context *)(ulong)(num_rects + 1U & 0xfffffffe);
    lVar24 = uVar20 - 1;
    auVar22._8_4_ = (int)lVar24;
    auVar22._0_8_ = lVar24;
    auVar22._12_4_ = (int)((ulong)lVar24 >> 0x20);
    piVar9 = &rects[1].was_packed;
    psVar10 = (stbrp_context *)0x0;
    auVar22 = auVar22 ^ _DAT_0015f440;
    auVar23 = _DAT_00162a00;
    do {
      auVar25 = auVar23 ^ auVar4;
      if ((bool)(~(auVar25._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar25._0_4_ ||
                  auVar22._4_4_ < auVar25._4_4_) & 1)) {
        piVar9[-4] = (int)psVar10;
      }
      if ((auVar25._12_4_ != auVar22._12_4_ || auVar25._8_4_ <= auVar22._8_4_) &&
          auVar25._12_4_ <= auVar22._12_4_) {
        *piVar9 = (int)psVar10 + 1;
      }
      psVar10 = (stbrp_context *)((long)&psVar10->width + 2);
      lVar24 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 2;
      auVar23._8_8_ = lVar24 + 2;
      piVar9 = piVar9 + 8;
    } while (in_RAX != psVar10);
  }
  __nmemb = (size_t)num_rects;
  if (1 < (uint)num_rects) {
    qsort(rects,__nmemb,0x10,rect_height_compare);
    in_RAX = extraout_RAX;
  }
  local_60 = __nmemb;
  local_58 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    ppsVar7 = &context->active_head;
    uVar14 = 0;
    local_50 = uVar20;
    local_48 = rects;
    do {
      in_RAX = (stbrp_context *)(uVar14 * 0x10);
      psVar16 = rects + uVar14;
      uVar1 = rects[uVar14].w;
      if ((uVar1 == 0) || (uVar2 = psVar16->h, uVar2 == 0)) {
        psVar16->x = 0;
        psVar16->y = 0;
      }
      else {
        iVar17 = context->width;
        iVar8 = context->align;
        iVar18 = (uint)uVar1 + iVar8 + -1;
        x0 = iVar18 - iVar18 % iVar8;
        in_RAX = (stbrp_context *)((long)iVar18 / (long)iVar8 & 0xffffffff);
        if (x0 <= iVar17) {
          uVar12 = context->height;
          local_78 = (uint)uVar2;
          in_RAX = (stbrp_context *)(ulong)uVar12;
          if ((int)local_78 <= (int)uVar12) {
            psVar10 = (stbrp_context *)*ppsVar7;
            uVar3 = (ushort)psVar10->width;
            local_40 = (ulong)uVar1;
            local_38 = psVar16;
            if (iVar17 < (int)(x0 + (uint)uVar3)) {
              iVar8 = context->heuristic;
              local_90 = (stbrp_node *)0x0;
              local_a0 = 0x40000000;
              local_9c = 0x40000000;
              in_RAX = (stbrp_context *)0x0;
            }
            else {
              local_a0 = 0x40000000;
              local_90 = (stbrp_node *)0x0;
              local_9c = 0x40000000;
              psVar13 = psVar10;
              psVar21 = (stbrp_node *)ppsVar7;
              uVar1 = uVar3;
              do {
                uVar19 = stbrp__skyline_find_min_y
                                   (psVar13,(stbrp_node *)(ulong)uVar1,x0,(int)&local_64,
                                    (int *)in_R8);
                iVar8 = context->heuristic;
                if (iVar8 == 0) {
                  if ((int)uVar19 < (int)local_a0) {
                    local_a0 = uVar19;
                    local_90 = psVar21;
                  }
                }
                else if (((int)(uVar2 + uVar19) <= (int)uVar12) &&
                        (((int)uVar19 < (int)local_a0 || (local_64 < local_9c && uVar19 == local_a0)
                         ))) {
                  local_9c = local_64;
                  local_a0 = uVar19;
                  local_90 = psVar21;
                }
                psVar21 = (stbrp_node *)&psVar13->align;
                uVar1 = (ushort)(*(stbrp_context **)&psVar13->align)->width;
                psVar13 = *(stbrp_context **)&psVar13->align;
              } while ((int)(x0 + (uint)uVar1) <= iVar17);
              if (local_90 == (stbrp_node *)0x0) {
                local_90 = (stbrp_node *)0x0;
                in_RAX = (stbrp_context *)0x0;
              }
              else {
                in_RAX = (stbrp_context *)(ulong)(*(stbrp_node **)local_90)->x;
              }
            }
            local_80._0_4_ = (int)in_RAX;
            psVar13 = psVar10;
            if (iVar8 == 1) {
              while (psVar21 = (stbrp_node *)ppsVar7, local_80 = in_RAX, (int)(uint)uVar3 < x0) {
                uVar3 = (ushort)(*(stbrp_context **)&psVar13->align)->width;
                psVar13 = *(stbrp_context **)&psVar13->align;
              }
              do {
                uVar19 = (uint)(ushort)psVar13->width - x0;
                psVar15 = psVar21;
                psVar5 = psVar10;
                do {
                  psVar10 = psVar5;
                  psVar21 = psVar15;
                  psVar15 = (stbrp_node *)&psVar10->align;
                  psVar5 = *(stbrp_context **)&psVar10->align;
                } while ((int)(uint)(ushort)(*(stbrp_context **)&psVar10->align)->width <=
                         (int)uVar19);
                uVar6 = stbrp__skyline_find_min_y
                                  (psVar10,(stbrp_node *)(ulong)uVar19,x0,(int)&local_68,
                                   (int *)in_R8);
                in_RAX = (stbrp_context *)(ulong)uVar6;
                if ((((int)(uVar2 + uVar6) <= (int)uVar12) && ((int)uVar6 <= (int)local_a0)) &&
                   (((uVar6 < local_a0 || (local_68 < local_9c)) ||
                    ((local_68 == local_9c && ((int)uVar19 < (int)local_80)))))) {
                  local_9c = local_68;
                  local_80 = (stbrp_context *)(ulong)uVar19;
                  local_a0 = uVar6;
                  local_90 = psVar21;
                }
                psVar13 = *(stbrp_context **)&psVar13->align;
              } while (psVar13 != (stbrp_context *)0x0);
            }
            in_R8 = local_90;
            psVar16 = local_38;
            rects = local_48;
            uVar20 = local_50;
            if (local_90 != (stbrp_node *)0x0) {
              uVar19 = uVar2 + local_a0;
              in_RAX = (stbrp_context *)(ulong)uVar19;
              if (((int)uVar19 <= (int)uVar12) &&
                 (psVar21 = context->free_head, in_RAX = context, psVar21 != (stbrp_node *)0x0)) {
                psVar21->x = (stbrp_coord)(int)local_80;
                psVar21->y = (stbrp_coord)uVar19;
                context->free_head = psVar21->next;
                psVar15 = *(stbrp_node **)local_90;
                psVar11 = psVar15;
                if ((int)(uint)psVar15->x < (int)local_80) {
                  psVar11 = psVar15->next;
                  local_90 = (stbrp_node *)&psVar15->next;
                }
                *(stbrp_node **)local_90 = psVar21;
                in_R8 = psVar11->next;
                iVar17 = (int)local_80 + (int)local_40;
                if (in_R8 != (stbrp_node *)0x0) {
                  do {
                    psVar15 = in_R8;
                    in_R8 = (stbrp_node *)(ulong)psVar15->x;
                    if (iVar17 < (int)(uint)psVar15->x) goto LAB_00132032;
                    psVar11->next = context->free_head;
                    context->free_head = psVar11;
                    psVar11 = psVar15;
                    in_R8 = psVar15->next;
                  } while (psVar15->next != (stbrp_node *)0x0);
                  in_R8 = (stbrp_node *)0x0;
                }
LAB_00132032:
                psVar21->next = psVar11;
                if ((int)(uint)psVar11->x < iVar17) {
                  psVar11->x = (stbrp_coord)iVar17;
                }
                local_38->x = (stbrp_coord)(int)local_80;
                in_RAX = (stbrp_context *)(ulong)local_a0;
                local_38->y = (stbrp_coord)local_a0;
                goto LAB_00132021;
              }
            }
          }
        }
        psVar16->x = 0xffff;
        psVar16->y = 0xffff;
      }
LAB_00132021:
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar20);
  }
  uVar12 = (uint)local_58;
  if (1 < uVar12) {
    qsort(rects,local_60,0x10,rect_original_order);
    in_RAX = extraout_RAX_00;
  }
  if (0 < (int)uVar12) {
    in_RAX = (stbrp_context *)0x0;
    do {
      uVar12 = 1;
      if (*(short *)((long)&rects->x + (long)in_RAX) == -1) {
        uVar12 = (uint)(*(short *)((long)&rects->y + (long)in_RAX) != -1);
      }
      *(uint *)((long)&rects->was_packed + (long)in_RAX) = uVar12;
      in_RAX = (stbrp_context *)((long)in_RAX + 0x10);
    } while ((stbrp_context *)(uVar20 * 0x10) != in_RAX);
  }
  return (int)in_RAX;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}